

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

int AF_AActor_SpawnMissileZ
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  double z_00;
  PClassActor *type_00;
  AActor *pAVar1;
  bool bVar2;
  bool local_74;
  bool local_71;
  AActor *local_70;
  bool local_63;
  AActor *state;
  MetaClass *type;
  AActor *dest;
  double z;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x198a,
                  "int AF_AActor_SpawnMissileZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  bVar2 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar2 = true, (param->field_0).field_1.atag != 1)) {
    bVar2 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar2) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x198a,
                  "int AF_AActor_SpawnMissileZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  pAVar1 = (AActor *)(param->field_0).field_1.a;
  local_63 = true;
  if (pAVar1 != (AActor *)0x0) {
    local_63 = DObject::IsKindOf((DObject *)pAVar1,AActor::RegistrationInfo.MyClass);
  }
  if (local_63 == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x198a,
                  "int AF_AActor_SpawnMissileZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x198b,
                  "int AF_AActor_SpawnMissileZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  if (param[1].field_0.field_3.Type != '\x01') {
    __assert_fail("param[paramnum].Type == REGT_FLOAT",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x198b,
                  "int AF_AActor_SpawnMissileZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  z_00 = param[1].field_0.f;
  if (numparam < 3) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x198c,
                  "int AF_AActor_SpawnMissileZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  bVar2 = false;
  if ((param[2].field_0.field_3.Type == '\x03') &&
     (bVar2 = true, param[2].field_0.field_1.atag != 1)) {
    bVar2 = param[2].field_0.field_1.a == (void *)0x0;
  }
  if (!bVar2) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x198c,
                  "int AF_AActor_SpawnMissileZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  if (param[2].field_0.field_1.a == (void *)0x0) {
    NullParam("\"dest\"");
    local_70 = (AActor *)param[2].field_0.field_1.a;
  }
  else {
    local_70 = (AActor *)param[2].field_0.field_1.a;
  }
  local_71 = true;
  if (local_70 != (AActor *)0x0) {
    local_71 = DObject::IsKindOf((DObject *)local_70,AActor::RegistrationInfo.MyClass);
  }
  if (local_71 == false) {
    __assert_fail("dest == NULL || dest->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x198c,
                  "int AF_AActor_SpawnMissileZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  if (numparam < 4) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x198d,
                  "int AF_AActor_SpawnMissileZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  bVar2 = false;
  if ((param[3].field_0.field_3.Type == '\x03') &&
     (bVar2 = true, param[3].field_0.field_1.atag != 1)) {
    bVar2 = param[3].field_0.field_1.a == (void *)0x0;
  }
  if (bVar2) {
    type_00 = (PClassActor *)param[3].field_0.field_1.a;
    local_74 = true;
    if (type_00 != (PClassActor *)0x0) {
      local_74 = PClass::IsDescendantOf((PClass *)type_00,AActor::RegistrationInfo.MyClass);
    }
    if (local_74 != false) {
      pAVar1 = P_SpawnMissileZ(pAVar1,z_00,local_70,type_00);
      if (numret < 1) {
        param_local._4_4_ = 0;
      }
      else {
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                        ,0x198e,
                        "int AF_AActor_SpawnMissileZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        VMReturn::SetPointer(ret,pAVar1,1);
        param_local._4_4_ = 1;
      }
      return param_local._4_4_;
    }
    __assert_fail("type == NULL || type->IsDescendantOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                  ,0x198d,
                  "int AF_AActor_SpawnMissileZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_mobj.cpp"
                ,0x198d,
                "int AF_AActor_SpawnMissileZ(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, SpawnMissileZ)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_FLOAT(z);
	PARAM_OBJECT_NOT_NULL(dest, AActor);
	PARAM_CLASS(type, AActor);
	ACTION_RETURN_OBJECT(P_SpawnMissileZ(self, z, dest, type));
}